

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float64 helper_rintd_arm(float64 x,void *fp_status)

{
  uint uVar1;
  float64 fVar2;
  float64 ret;
  int new_flags;
  int old_flags;
  void *fp_status_local;
  float64 x_local;
  
  uVar1 = get_float_exception_flags((float_status *)fp_status);
  fVar2 = float64_round_to_int_arm(x,(float_status *)fp_status);
  get_float_exception_flags((float_status *)fp_status);
  if ((uVar1 & 0x20) == 0) {
    uVar1 = get_float_exception_flags((float_status *)fp_status);
    set_float_exception_flags(uVar1 & 0xffffffdf,(float_status *)fp_status);
  }
  return fVar2;
}

Assistant:

float64 HELPER(rintd)(float64 x, void *fp_status)
{
    int old_flags = get_float_exception_flags(fp_status), new_flags;
    float64 ret;

    ret = float64_round_to_int(x, fp_status);

    new_flags = get_float_exception_flags(fp_status);

    /* Suppress any inexact exceptions the conversion produced */
    if (!(old_flags & float_flag_inexact)) {
        new_flags = get_float_exception_flags(fp_status);
        set_float_exception_flags(new_flags & ~float_flag_inexact, fp_status);
    }

    return ret;
}